

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_info.h
# Opt level: O0

void __thiscall nodecpp::StackInfo::~StackInfo(StackInfo *this)

{
  StackInfo *this_local;
  
  ~StackInfo(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~StackInfo() {}